

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModuleManager.h
# Opt level: O2

void __thiscall Scine::Core::ModuleManager::Impl::Impl(Impl *this)

{
  bool bVar1;
  char *__s;
  pointer pbVar2;
  string modulePath;
  path ret;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_a8;
  path coreLocationParent;
  path executableParentPath;
  error_code ec;
  
  (this->_sources).
  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->_sources).
  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->_sources).
  super__Vector_base<Scine::Core::ModuleManager::Impl::LibraryAndModules,_std::allocator<Scine::Core::ModuleManager::Impl::LibraryAndModules>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  boost::dll::program_location();
  boost::filesystem::path::parent_path();
  std::__cxx11::string::~string((string *)&modulePath);
  tryLoadModulesInPath(this,&executableParentPath);
  tryAdjacentDirectories(this,&executableParentPath);
  ret.m_pathname._M_dataplus._M_p = (pointer)&ret.m_pathname.field_2;
  ret.m_pathname._M_string_length = 0;
  ret.m_pathname.field_2._M_local_buf[0] = '\0';
  ec.val_ = 0;
  ec.failed_ = false;
  ec.cat_ = &boost::system::detail::cat_holder<void>::system_category_instance.super_error_category;
  boost::dll::anon_unknown_3::this_line_location((path *)&modulePath,&ec);
  std::__cxx11::string::operator=((string *)&ret,(string *)&modulePath);
  std::__cxx11::string::~string((string *)&modulePath);
  if (ec.failed_ == true) {
    boost::dll::detail::report_error(&ec,"boost::dll::this_line_location() failed");
  }
  boost::filesystem::path::parent_path();
  std::__cxx11::string::~string((string *)&ret);
  tryLoadModulesInPath(this,&coreLocationParent);
  boost::filesystem::path::parent_path();
  boost::filesystem::path::parent_path();
  bVar1 = boost::filesystem::operator!=((path *)&modulePath,&ret);
  std::__cxx11::string::~string((string *)&ret);
  std::__cxx11::string::~string((string *)&modulePath);
  if (bVar1) {
    tryAdjacentDirectories(this,&coreLocationParent);
  }
  __s = getenv("SCINE_MODULE_PATH");
  if (__s != (char *)0x0) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&modulePath,__s,(allocator<char> *)&ret);
    Detail::split(&local_a8,&modulePath,':');
    for (pbVar2 = local_a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pbVar2 != local_a8.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pbVar2 = pbVar2 + 1) {
      if (pbVar2->_M_string_length != 0) {
        std::__cxx11::string::string((string *)&ret,(string *)pbVar2);
        bVar1 = boost::filesystem::exists(&ret);
        if (bVar1) {
          std::__cxx11::string::string((string *)&ec,(string *)pbVar2);
          bVar1 = boost::filesystem::is_directory((path *)&ec);
          std::__cxx11::string::~string((string *)&ec);
          std::__cxx11::string::~string((string *)&ret);
          if (!bVar1) goto LAB_0010f88d;
          std::__cxx11::string::string((string *)&ret,(string *)pbVar2);
          tryLoadModulesInPath(this,&ret);
        }
        std::__cxx11::string::~string((string *)&ret);
      }
LAB_0010f88d:
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_a8);
    std::__cxx11::string::~string((string *)&modulePath);
  }
  std::__cxx11::string::~string((string *)&coreLocationParent);
  std::__cxx11::string::~string((string *)&executableParentPath);
  return;
}

Assistant:

Impl() {
    /* Try to load modules in several paths: */
    const auto executableParentPath = boost::dll::program_location().parent_path();
    tryLoadModulesInPath(executableParentPath);
    tryAdjacentDirectories(executableParentPath);
    const auto coreLocationParent = boost::dll::this_line_location().parent_path();
    tryLoadModulesInPath(coreLocationParent);
    if (coreLocationParent.parent_path() != executableParentPath.parent_path()) {
      tryAdjacentDirectories(coreLocationParent);
    }

    // SCINE_MODULE_PATH environment variable. Path separators are os-dependent!
#ifdef _WIN32
    const char pathSep = ';';
#else
    const char pathSep = ':';
#endif

    if (const char* pathPtr = std::getenv("SCINE_MODULE_PATH")) {
      std::string modulePath = pathPtr;

      for (const auto& singlePath : Detail::split(modulePath, pathSep)) {
        if (!singlePath.empty() && boost::filesystem::exists(singlePath) && boost::filesystem::is_directory(singlePath)) {
          tryLoadModulesInPath(singlePath);
        }
      }
    }
  }